

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v6::internal::
    parse_nonnegative_int<wchar_t,fmt::v6::internal::width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>>&,wchar_t>&>
              (wchar_t **begin,wchar_t *end,
              width_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<wchar_t,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
              *eh)

{
  wchar_t *pwVar1;
  uint uVar2;
  wchar_t *pwVar3;
  
  uVar2 = 0;
  pwVar1 = *begin;
  while (pwVar3 = pwVar1 + 1, uVar2 < 0xccccccd) {
    uVar2 = (*pwVar1 + uVar2 * 10) - 0x30;
    *begin = pwVar3;
    if ((pwVar3 == end) || (pwVar1 = pwVar3, 9 < (uint)(*pwVar3 + L'\xffffffd0')))
    goto LAB_0018581a;
  }
  uVar2 = 0x80000000;
LAB_0018581a:
  if ((int)uVar2 < 0) {
    error_handler::on_error((error_handler *)begin,"number is too big");
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}